

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glib_compat.c
# Opt level: O0

guint g_hash_table_lookup_node(GHashTable *hash_table,gconstpointer key)

{
  gboolean gVar1;
  int local_2c;
  uint local_28;
  guint step;
  guint hash_value;
  guint node_index;
  GHashNode *node;
  gconstpointer key_local;
  GHashTable *hash_table_local;
  
  local_2c = 0;
  local_28 = (*hash_table->hash_func)(key);
  if (local_28 < 2) {
    local_28 = 2;
  }
  step = local_28 % (uint)hash_table->mod;
  _hash_value = hash_table->nodes + step;
  do {
    if (_hash_value->key_hash == 0) {
      return step;
    }
    if (_hash_value->key_hash == local_28) {
      if (hash_table->key_equal_func == (GEqualFunc)0x0) {
        if (_hash_value->key == key) {
          return step;
        }
      }
      else {
        gVar1 = (*hash_table->key_equal_func)(_hash_value->key,key);
        if (gVar1 != 0) {
          return step;
        }
      }
    }
    local_2c = local_2c + 1;
    step = hash_table->mask & local_2c + step;
    _hash_value = hash_table->nodes + step;
  } while( true );
}

Assistant:

static inline guint g_hash_table_lookup_node (GHashTable    *hash_table,
        gconstpointer  key)
{
    GHashNode *node;
    guint node_index;
    guint hash_value;
    guint step = 0;

    /* Empty buckets have hash_value set to 0, and for tombstones, it's 1.
     * We need to make sure our hash value is not one of these. */

    hash_value = (* hash_table->hash_func) (key);
    if (hash_value <= 1)
        hash_value = 2;

    node_index = hash_value % hash_table->mod;
    node = &hash_table->nodes [node_index];

    while (node->key_hash)
    {
        /*  We first check if our full hash values
         *  are equal so we can avoid calling the full-blown
         *  key equality function in most cases.
         */

        if (node->key_hash == hash_value)
        {
            if (hash_table->key_equal_func)
            {
                if (hash_table->key_equal_func (node->key, key))
                    break;
            }
            else if (node->key == key)
            {
                break;
            }
        }

        step++;
        node_index += step;
        node_index &= hash_table->mask;
        node = &hash_table->nodes [node_index];
    }

    return node_index;
}